

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS
ref_cell_list_with2(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT max_cell,REF_INT *ncell,
                   REF_INT *cell_list)

{
  REF_INT *pRVar1;
  REF_ADJ_ITEM pRVar2;
  ulong uVar3;
  long lVar4;
  REF_INT RVar5;
  
  *ncell = 0;
  RVar5 = -1;
  uVar3 = 0xffffffff;
  if (-1 < node0) {
    uVar3 = 0xffffffff;
    if (node0 < ref_cell->ref_adj->nnode) {
      uVar3 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node0];
    }
  }
  if ((int)uVar3 != -1) {
    RVar5 = ref_cell->ref_adj->item[(int)uVar3].ref;
  }
  do {
    if ((int)uVar3 == -1) {
      return 0;
    }
    if (0 < ref_cell->node_per) {
      pRVar1 = ref_cell->c2n;
      lVar4 = 0;
      do {
        if (pRVar1[(long)ref_cell->size_per * (long)RVar5 + lVar4] == node1) {
          if (max_cell <= *ncell) {
            return 7;
          }
          cell_list[*ncell] = RVar5;
          *ncell = *ncell + 1;
        }
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 < ref_cell->node_per);
    }
    pRVar2 = ref_cell->ref_adj->item;
    uVar3 = (ulong)pRVar2[(int)uVar3].next;
    if (uVar3 == 0xffffffffffffffff) {
      RVar5 = -1;
    }
    else {
      RVar5 = pRVar2[uVar3].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_list_with2(REF_CELL ref_cell, REF_INT node0,
                                       REF_INT node1, REF_INT max_cell,
                                       REF_INT *ncell, REF_INT *cell_list) {
  REF_INT cell, item, cell_node;

  *ncell = 0;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    if (*ncell >= max_cell) return REF_INCREASE_LIMIT;
    cell_list[*ncell] = cell;
    (*ncell)++;
  }

  return REF_SUCCESS;
}